

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O3

int i2c_block_process_call(int pi,uint handle,uint reg,char *buf,uint count)

{
  int __state;
  int sent;
  gpioExtent_t ext [1];
  
  ext[0].size = (size_t)count;
  ext[0].ptr = buf;
  sent = pigpio_command_ext(pi,0x46,handle,reg,count,1,ext,0);
  if (0 < sent) {
    sent = recvMax(pi,buf,0x20,sent);
  }
  __state = gCancelState[pi];
  pthread_mutex_unlock((pthread_mutex_t *)(gCmdMutex + pi));
  pthread_setcancelstate(__state,(int *)0x0);
  return sent;
}

Assistant:

int i2c_block_process_call(
   int pi, unsigned handle, unsigned reg, char *buf, unsigned count)
{
   int bytes;
   gpioExtent_t ext[1];

   /*
   p1=handle
   p2=reg
   p3=count
   ## extension ##
   char buf[count]
   */

   ext[0].size = count;
   ext[0].ptr = buf;

   bytes = pigpio_command_ext
      (pi, PI_CMD_I2CPK, handle, reg, count, 1, ext, 0);

   if (bytes > 0)
   {
      bytes = recvMax(pi, buf, 32, bytes);
   }

   _pmu(pi);

   return bytes;
}